

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::resolveReference(Value *this,char *key)

{
  bool bVar1;
  size_t sVar2;
  iterator __pos;
  CZString actualKey;
  value_type defaultValue;
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)&defaultValue,objectValue);
    swap((Value *)&defaultValue,this);
    ~Value((Value *)&defaultValue);
  }
  else if (*(char *)&this->bits_ != '\a') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&defaultValue);
    std::operator<<((ostream *)&defaultValue,
                    "in Json::Value::resolveReference(): requires objectValue");
    std::__cxx11::stringbuf::str();
    throwLogicError((String *)&actualKey);
  }
  sVar2 = strlen(key);
  actualKey.field_1.index_ = (int)sVar2 << 2;
  actualKey.cstr_ = key;
  __pos = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::lower_bound(&((this->value_).map_)->_M_t,&actualKey);
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = CZString::operator==((CZString *)(__pos._M_node + 1),&actualKey);
    if (bVar1) goto LAB_0075b55d;
  }
  nullSingleton();
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            (&defaultValue,&actualKey,&nullSingleton::nullStatic);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,&defaultValue);
  std::pair<const_Json::Value::CZString,_Json::Value>::~pair(&defaultValue);
LAB_0075b55d:
  CZString::~CZString(&actualKey);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::resolveReference(const char* key) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type() == nullValue)
    *this = Value(objectValue);
  CZString actualKey(key, static_cast<unsigned>(strlen(key)),
                     CZString::noDuplication); // NOTE!
  auto it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}